

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void stbtt__csctx_rmove_to(stbtt__csctx *ctx,float dx,float dy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  
  stbtt__csctx_close_shape(ctx);
  uVar1 = ctx->x;
  uVar2 = ctx->y;
  fVar3 = dx + (float)uVar1;
  fVar4 = dy + (float)uVar2;
  ctx->first_x = fVar3;
  ctx->first_y = fVar4;
  ctx->x = fVar3;
  ctx->y = fVar4;
  stbtt__csctx_v(ctx,'\x01',(int)fVar3,(int)fVar4,0,0,0,0);
  return;
}

Assistant:

static void stbtt__csctx_rmove_to(stbtt__csctx *ctx, float dx, float dy)
{
   stbtt__csctx_close_shape(ctx);
   ctx->first_x = ctx->x = ctx->x + dx;
   ctx->first_y = ctx->y = ctx->y + dy;
   stbtt__csctx_v(ctx, STBTT_vmove, (int)ctx->x, (int)ctx->y, 0, 0, 0, 0);
}